

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

Field * google::protobuf::internal::anon_unknown_0::MakeFastFieldEntry
                  (Field *__return_storage_ptr__,FieldEntryInfo *entry,FieldOptions *options,
                  MessageOptions *message_options)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  EnumRangeInfo EVar4;
  CppStringType CVar5;
  LogMessage *pLVar6;
  TcParseFunction local_15d;
  TcParseFunction local_15c;
  TcParseFunction local_15a;
  TcParseFunction local_159;
  TcParseFunction local_157;
  TcParseFunction local_156;
  TcParseFunction local_154;
  TcParseFunction local_152;
  TcParseFunction local_151;
  TcParseFunction local_14f;
  TcParseFunction local_14e;
  TcParseFunction local_14c;
  TcParseFunction local_14b;
  TcParseFunction local_149;
  TcParseFunction local_148;
  TcParseFunction local_146;
  TcParseFunction local_144;
  TcParseFunction local_143;
  TcParseFunction local_141;
  TcParseFunction local_140;
  TcParseFunction local_13e;
  TcParseFunction local_13d;
  TcParseFunction local_13b;
  TcParseFunction local_139;
  TcParseFunction local_138;
  TcParseFunction local_136;
  TcParseFunction local_135;
  TcParseFunction local_133;
  TcParseFunction local_132;
  TcParseFunction local_130;
  TcParseFunction local_12e;
  TcParseFunction local_12d;
  TcParseFunction local_12b;
  TcParseFunction local_12a;
  TcParseFunction local_128;
  TcParseFunction local_127;
  TcParseFunction local_125;
  TcParseFunction local_122;
  TcParseFunction local_121;
  TcParseFunction local_11f;
  TcParseFunction local_11e;
  TcParseFunction local_11c;
  TcParseFunction local_11b;
  TcParseFunction local_119;
  TcParseFunction local_117;
  TcParseFunction local_116;
  TcParseFunction local_114;
  TcParseFunction local_113;
  TcParseFunction local_111;
  TcParseFunction local_10f;
  TcParseFunction local_10e;
  TcParseFunction local_10c;
  TcParseFunction local_10b;
  TcParseFunction local_109;
  TcParseFunction local_107;
  TcParseFunction local_106;
  TcParseFunction local_104;
  TcParseFunction local_103;
  TcParseFunction local_101;
  TcParseFunction local_ff;
  TcParseFunction local_fe;
  TcParseFunction local_fc;
  TcParseFunction local_fb;
  TcParseFunction local_f9;
  TcParseFunction local_ef;
  TcParseFunction local_ee;
  TcParseFunction local_ec;
  TcParseFunction local_eb;
  TcParseFunction local_e9;
  TcParseFunction local_e7;
  TcParseFunction local_e6;
  TcParseFunction local_e4;
  TcParseFunction local_e3;
  TcParseFunction local_e1;
  TcParseFunction local_df;
  TcParseFunction local_de;
  TcParseFunction local_dc;
  TcParseFunction local_db;
  TcParseFunction local_d9;
  TcParseFunction local_d7;
  TcParseFunction local_d6;
  TcParseFunction local_d4;
  TcParseFunction local_d3;
  TcParseFunction local_d1;
  TcParseFunction local_cf;
  TcParseFunction local_ce;
  TcParseFunction local_cc;
  TcParseFunction local_cb;
  TcParseFunction local_c9;
  TcParseFunction local_c7;
  TcParseFunction local_c6;
  TcParseFunction local_c4;
  TcParseFunction local_c3;
  TcParseFunction local_c1;
  TcParseFunction local_bf;
  TcParseFunction local_be;
  TcParseFunction local_bc;
  TcParseFunction local_bb;
  TcParseFunction local_b9;
  TcParseFunction local_b7;
  TcParseFunction local_b6;
  TcParseFunction local_b4;
  TcParseFunction local_b3;
  TcParseFunction local_b1;
  Field *info;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  LogMessageFatal local_78 [18];
  Voidify local_66;
  TcParseFunction local_65;
  TcParseFunction picked;
  byte local_51;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field;
  MessageOptions *message_options_local;
  FieldOptions *options_local;
  FieldEntryInfo *entry_local;
  
  field = (FieldDescriptor *)message_options;
  message_options_local = (MessageOptions *)options;
  options_local = (FieldOptions *)entry;
  memset(__return_storage_ptr__,0,0x18);
  local_28 = options_local->field;
  __return_storage_ptr__->aux_idx = (uint8_t)options_local->lazy_opt;
  TVar2 = FieldDescriptor::type(local_28);
  if (((TVar2 == TYPE_BYTES) || (TVar2 = FieldDescriptor::type(local_28), TVar2 == TYPE_STRING)) &&
     ((message_options_local[6].is_lite & 1U) != 0)) {
    bVar1 = FieldDescriptor::is_repeated(local_28);
    local_51 = 0;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_50,"!field->is_repeated()");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_gen.cc"
                 ,0xb5,local_50._M_len,local_50._M_str);
      local_51 = 1;
      pLVar6 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar6);
    }
    if ((local_51 & 1) != 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
    }
    __return_storage_ptr__->aux_idx = SUB41(options_local->presence_probability,0);
  }
  local_65 = kNone;
  TVar2 = FieldDescriptor::type(local_28);
  switch(TVar2) {
  case TYPE_DOUBLE:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    bVar1 = FieldDescriptor::is_packed(local_28);
    if (bVar1) {
      iVar3 = FieldDescriptor::number(local_28);
      local_e1 = kFastF64P1;
      if (0xf < iVar3) {
        local_e1 = kFastF64P2;
      }
      local_e3 = local_e1;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(local_28);
      if (bVar1) {
        iVar3 = FieldDescriptor::number(local_28);
        local_e4 = kFastF64R1;
        if (0xf < iVar3) {
          local_e4 = kFastF64R2;
        }
        local_e6 = local_e4;
      }
      else {
        iVar3 = FieldDescriptor::number(local_28);
        local_e7 = kFastF64S1;
        if (0xf < iVar3) {
          local_e7 = kFastF64S2;
        }
        local_e6 = local_e7;
      }
      local_e3 = local_e6;
    }
    local_65 = local_e3;
    break;
  case TYPE_FLOAT:
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    bVar1 = FieldDescriptor::is_packed(local_28);
    if (bVar1) {
      iVar3 = FieldDescriptor::number(local_28);
      local_d9 = kFastF32P1;
      if (0xf < iVar3) {
        local_d9 = kFastF32P2;
      }
      local_db = local_d9;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(local_28);
      if (bVar1) {
        iVar3 = FieldDescriptor::number(local_28);
        local_dc = kFastF32R1;
        if (0xf < iVar3) {
          local_dc = kFastF32R2;
        }
        local_de = local_dc;
      }
      else {
        iVar3 = FieldDescriptor::number(local_28);
        local_df = kFastF32S1;
        if (0xf < iVar3) {
          local_df = kFastF32S2;
        }
        local_de = local_df;
      }
      local_db = local_de;
    }
    local_65 = local_db;
    break;
  case TYPE_INT64:
  case TYPE_UINT64:
    bVar1 = FieldDescriptor::is_packed(local_28);
    if (bVar1) {
      iVar3 = FieldDescriptor::number(local_28);
      local_c9 = kFastV64P1;
      if (0xf < iVar3) {
        local_c9 = kFastV64P2;
      }
      local_cb = local_c9;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(local_28);
      if (bVar1) {
        iVar3 = FieldDescriptor::number(local_28);
        local_cc = kFastV64R1;
        if (0xf < iVar3) {
          local_cc = kFastV64R2;
        }
        local_ce = local_cc;
      }
      else {
        iVar3 = FieldDescriptor::number(local_28);
        local_cf = kFastV64S1;
        if (0xf < iVar3) {
          local_cf = kFastV64S2;
        }
        local_ce = local_cf;
      }
      local_cb = local_ce;
    }
    local_65 = local_cb;
    break;
  case TYPE_INT32:
  case TYPE_UINT32:
    bVar1 = FieldDescriptor::is_packed(local_28);
    if (bVar1) {
      iVar3 = FieldDescriptor::number(local_28);
      local_b9 = kFastV32P1;
      if (0xf < iVar3) {
        local_b9 = kFastV32P2;
      }
      local_bb = local_b9;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(local_28);
      if (bVar1) {
        iVar3 = FieldDescriptor::number(local_28);
        local_bc = kFastV32R1;
        if (0xf < iVar3) {
          local_bc = kFastV32R2;
        }
        local_be = local_bc;
      }
      else {
        iVar3 = FieldDescriptor::number(local_28);
        local_bf = kFastV32S1;
        if (0xf < iVar3) {
          local_bf = kFastV32S2;
        }
        local_be = local_bf;
      }
      local_bb = local_be;
    }
    local_65 = local_bb;
    break;
  case TYPE_BOOL:
    bVar1 = FieldDescriptor::is_packed(local_28);
    if (bVar1) {
      iVar3 = FieldDescriptor::number(local_28);
      local_b1 = kFastV8P1;
      if (0xf < iVar3) {
        local_b1 = kFastV8P2;
      }
      local_b3 = local_b1;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(local_28);
      if (bVar1) {
        iVar3 = FieldDescriptor::number(local_28);
        local_b4 = kFastV8R1;
        if (0xf < iVar3) {
          local_b4 = kFastV8R2;
        }
        local_b6 = local_b4;
      }
      else {
        iVar3 = FieldDescriptor::number(local_28);
        local_b7 = kFastV8S1;
        if (0xf < iVar3) {
          local_b7 = kFastV8S2;
        }
        local_b6 = local_b7;
      }
      local_b3 = local_b6;
    }
    local_65 = local_b3;
    break;
  case TYPE_STRING:
    bVar1 = options_local->use_direct_tcparser_table;
    if (bVar1 == false) {
      CVar5 = FieldDescriptor::cpp_string_type(local_28);
      if (CVar5 == kCord) {
        iVar3 = FieldDescriptor::number(local_28);
        local_125 = kFastUcS1;
        if (0xf < iVar3) {
          local_125 = kFastUcS2;
        }
        local_127 = local_125;
      }
      else {
        if ((message_options_local[6].is_lite & 1U) == 0) {
          bVar1 = FieldDescriptor::is_repeated(local_28);
          if (bVar1) {
            iVar3 = FieldDescriptor::number(local_28);
            local_12b = kFastUR1;
            if (0xf < iVar3) {
              local_12b = kFastUR2;
            }
            local_12d = local_12b;
          }
          else {
            iVar3 = FieldDescriptor::number(local_28);
            local_12e = kFastUS1;
            if (0xf < iVar3) {
              local_12e = kFastUS2;
            }
            local_12d = local_12e;
          }
          local_12a = local_12d;
        }
        else {
          iVar3 = FieldDescriptor::number(local_28);
          local_128 = kFastUiS1;
          if (0xf < iVar3) {
            local_128 = kFastUiS2;
          }
          local_12a = local_128;
        }
        local_127 = local_12a;
      }
      local_65 = local_127;
    }
    else if (bVar1 == true) {
      CVar5 = FieldDescriptor::cpp_string_type(local_28);
      if (CVar5 == kCord) {
        iVar3 = FieldDescriptor::number(local_28);
        local_130 = kFastScS1;
        if (0xf < iVar3) {
          local_130 = kFastScS2;
        }
        local_132 = local_130;
      }
      else {
        if ((message_options_local[6].is_lite & 1U) == 0) {
          bVar1 = FieldDescriptor::is_repeated(local_28);
          if (bVar1) {
            iVar3 = FieldDescriptor::number(local_28);
            local_136 = kFastSR1;
            if (0xf < iVar3) {
              local_136 = kFastSR2;
            }
            local_138 = local_136;
          }
          else {
            iVar3 = FieldDescriptor::number(local_28);
            local_139 = kFastSS1;
            if (0xf < iVar3) {
              local_139 = kFastSS2;
            }
            local_138 = local_139;
          }
          local_135 = local_138;
        }
        else {
          iVar3 = FieldDescriptor::number(local_28);
          local_133 = kFastSiS1;
          if (0xf < iVar3) {
            local_133 = kFastSiS2;
          }
          local_135 = local_133;
        }
        local_132 = local_135;
      }
      local_65 = local_132;
    }
    else if (bVar1 == true) {
      CVar5 = FieldDescriptor::cpp_string_type(local_28);
      if (CVar5 == kCord) {
        iVar3 = FieldDescriptor::number(local_28);
        local_13b = kFastBcS1;
        if (0xf < iVar3) {
          local_13b = kFastBcS2;
        }
        local_13d = local_13b;
      }
      else {
        if ((message_options_local[6].is_lite & 1U) == 0) {
          bVar1 = FieldDescriptor::is_repeated(local_28);
          if (bVar1) {
            iVar3 = FieldDescriptor::number(local_28);
            local_141 = kFastBR1;
            if (0xf < iVar3) {
              local_141 = kFastBR2;
            }
            local_143 = local_141;
          }
          else {
            iVar3 = FieldDescriptor::number(local_28);
            local_144 = kFastBS1;
            if (0xf < iVar3) {
              local_144 = kFastBS2;
            }
            local_143 = local_144;
          }
          local_140 = local_143;
        }
        else {
          iVar3 = FieldDescriptor::number(local_28);
          local_13e = kFastBiS1;
          if (0xf < iVar3) {
            local_13e = kFastBiS2;
          }
          local_140 = local_13e;
        }
        local_13d = local_140;
      }
      local_65 = local_13d;
    }
    break;
  case TYPE_GROUP:
    if ((message_options_local[6].should_profile_driven_cluster_aux_subtable & 1U) == 0) {
      bVar1 = FieldDescriptor::is_repeated(local_28);
      if (bVar1) {
        iVar3 = FieldDescriptor::number(local_28);
        local_15a = kFastGdR1;
        if (0xf < iVar3) {
          local_15a = kFastGdR2;
        }
        local_15c = local_15a;
      }
      else {
        iVar3 = FieldDescriptor::number(local_28);
        local_15d = kFastGdS1;
        if (0xf < iVar3) {
          local_15d = kFastGdS2;
        }
        local_15c = local_15d;
      }
      local_159 = local_15c;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(local_28);
      if (bVar1) {
        iVar3 = FieldDescriptor::number(local_28);
        local_154 = kFastGtR1;
        if (0xf < iVar3) {
          local_154 = kFastGtR2;
        }
        local_156 = local_154;
      }
      else {
        iVar3 = FieldDescriptor::number(local_28);
        local_157 = kFastGtS1;
        if (0xf < iVar3) {
          local_157 = kFastGtS2;
        }
        local_156 = local_157;
      }
      local_159 = local_156;
    }
    local_65 = local_159;
    break;
  case TYPE_MESSAGE:
    bVar1 = HasLazyRep(local_28,(FieldOptions *)message_options_local);
    if (bVar1) {
      iVar3 = FieldDescriptor::number(local_28);
      local_146 = kFastMlS1;
      if (0xf < iVar3) {
        local_146 = kFastMlS2;
      }
      local_148 = local_146;
    }
    else {
      if ((message_options_local[6].should_profile_driven_cluster_aux_subtable & 1U) == 0) {
        bVar1 = FieldDescriptor::is_repeated(local_28);
        if (bVar1) {
          iVar3 = FieldDescriptor::number(local_28);
          local_14f = kFastMdR1;
          if (0xf < iVar3) {
            local_14f = kFastMdR2;
          }
          local_151 = local_14f;
        }
        else {
          iVar3 = FieldDescriptor::number(local_28);
          local_152 = kFastMdS1;
          if (0xf < iVar3) {
            local_152 = kFastMdS2;
          }
          local_151 = local_152;
        }
        local_14e = local_151;
      }
      else {
        bVar1 = FieldDescriptor::is_repeated(local_28);
        if (bVar1) {
          iVar3 = FieldDescriptor::number(local_28);
          local_149 = kFastMtR1;
          if (0xf < iVar3) {
            local_149 = kFastMtR2;
          }
          local_14b = local_149;
        }
        else {
          iVar3 = FieldDescriptor::number(local_28);
          local_14c = kFastMtS1;
          if (0xf < iVar3) {
            local_14c = kFastMtS2;
          }
          local_14b = local_14c;
        }
        local_14e = local_14b;
      }
      local_148 = local_14e;
    }
    local_65 = local_148;
    break;
  case TYPE_BYTES:
    CVar5 = FieldDescriptor::cpp_string_type(local_28);
    if (CVar5 == kCord) {
      iVar3 = FieldDescriptor::number(local_28);
      local_119 = kFastBcS1;
      if (0xf < iVar3) {
        local_119 = kFastBcS2;
      }
      local_11b = local_119;
    }
    else {
      if ((message_options_local[6].is_lite & 1U) == 0) {
        bVar1 = FieldDescriptor::is_repeated(local_28);
        if (bVar1) {
          iVar3 = FieldDescriptor::number(local_28);
          local_11f = kFastBR1;
          if (0xf < iVar3) {
            local_11f = kFastBR2;
          }
          local_121 = local_11f;
        }
        else {
          iVar3 = FieldDescriptor::number(local_28);
          local_122 = kFastBS1;
          if (0xf < iVar3) {
            local_122 = kFastBS2;
          }
          local_121 = local_122;
        }
        local_11e = local_121;
      }
      else {
        iVar3 = FieldDescriptor::number(local_28);
        local_11c = kFastBiS1;
        if (0xf < iVar3) {
          local_11c = kFastBiS2;
        }
        local_11e = local_11c;
      }
      local_11b = local_11e;
    }
    local_65 = local_11b;
    break;
  case TYPE_ENUM:
    bVar1 = TreatEnumAsInt(local_28);
    if (bVar1) {
      bVar1 = FieldDescriptor::is_packed(local_28);
      if (bVar1) {
        iVar3 = FieldDescriptor::number(local_28);
        local_e9 = kFastV32P1;
        if (0xf < iVar3) {
          local_e9 = kFastV32P2;
        }
        local_eb = local_e9;
      }
      else {
        bVar1 = FieldDescriptor::is_repeated(local_28);
        if (bVar1) {
          iVar3 = FieldDescriptor::number(local_28);
          local_ec = kFastV32R1;
          if (0xf < iVar3) {
            local_ec = kFastV32R2;
          }
          local_ee = local_ec;
        }
        else {
          iVar3 = FieldDescriptor::number(local_28);
          local_ef = kFastV32S1;
          if (0xf < iVar3) {
            local_ef = kFastV32S2;
          }
          local_ee = local_ef;
        }
        local_eb = local_ee;
      }
      local_65 = local_eb;
    }
    else {
      EVar4 = GetEnumRangeInfo(local_28,&__return_storage_ptr__->aux_idx);
      switch(EVar4) {
      case kNone:
        bVar1 = FieldDescriptor::is_packed(local_28);
        if (bVar1) {
          iVar3 = FieldDescriptor::number(local_28);
          local_f9 = kFastEvP1;
          if (0xf < iVar3) {
            local_f9 = kFastEvP2;
          }
          local_fb = local_f9;
        }
        else {
          bVar1 = FieldDescriptor::is_repeated(local_28);
          if (bVar1) {
            iVar3 = FieldDescriptor::number(local_28);
            local_fc = kFastEvR1;
            if (0xf < iVar3) {
              local_fc = kFastEvR2;
            }
            local_fe = local_fc;
          }
          else {
            iVar3 = FieldDescriptor::number(local_28);
            local_ff = kFastEvS1;
            if (0xf < iVar3) {
              local_ff = kFastEvS2;
            }
            local_fe = local_ff;
          }
          local_fb = local_fe;
        }
        local_65 = local_fb;
        break;
      case kContiguous:
        bVar1 = FieldDescriptor::is_packed(local_28);
        if (bVar1) {
          iVar3 = FieldDescriptor::number(local_28);
          local_101 = kFastErP1;
          if (0xf < iVar3) {
            local_101 = kFastErP2;
          }
          local_103 = local_101;
        }
        else {
          bVar1 = FieldDescriptor::is_repeated(local_28);
          if (bVar1) {
            iVar3 = FieldDescriptor::number(local_28);
            local_104 = kFastErR1;
            if (0xf < iVar3) {
              local_104 = kFastErR2;
            }
            local_106 = local_104;
          }
          else {
            iVar3 = FieldDescriptor::number(local_28);
            local_107 = kFastErS1;
            if (0xf < iVar3) {
              local_107 = kFastErS2;
            }
            local_106 = local_107;
          }
          local_103 = local_106;
        }
        local_65 = local_103;
        break;
      case kContiguous0:
        bVar1 = FieldDescriptor::is_packed(local_28);
        if (bVar1) {
          iVar3 = FieldDescriptor::number(local_28);
          local_109 = kFastEr0P1;
          if (0xf < iVar3) {
            local_109 = kFastEr0P2;
          }
          local_10b = local_109;
        }
        else {
          bVar1 = FieldDescriptor::is_repeated(local_28);
          if (bVar1) {
            iVar3 = FieldDescriptor::number(local_28);
            local_10c = kFastEr0R1;
            if (0xf < iVar3) {
              local_10c = kFastEr0R2;
            }
            local_10e = local_10c;
          }
          else {
            iVar3 = FieldDescriptor::number(local_28);
            local_10f = kFastEr0S1;
            if (0xf < iVar3) {
              local_10f = kFastEr0S2;
            }
            local_10e = local_10f;
          }
          local_10b = local_10e;
        }
        local_65 = local_10b;
        break;
      case kContiguous1:
        bVar1 = FieldDescriptor::is_packed(local_28);
        if (bVar1) {
          iVar3 = FieldDescriptor::number(local_28);
          local_111 = kFastEr1P1;
          if (0xf < iVar3) {
            local_111 = kFastEr1P2;
          }
          local_113 = local_111;
        }
        else {
          bVar1 = FieldDescriptor::is_repeated(local_28);
          if (bVar1) {
            iVar3 = FieldDescriptor::number(local_28);
            local_114 = kFastEr1R1;
            if (0xf < iVar3) {
              local_114 = kFastEr1R2;
            }
            local_116 = local_114;
          }
          else {
            iVar3 = FieldDescriptor::number(local_28);
            local_117 = kFastEr1S1;
            if (0xf < iVar3) {
              local_117 = kFastEr1S2;
            }
            local_116 = local_117;
          }
          local_113 = local_116;
        }
        local_65 = local_113;
      }
    }
    break;
  case TYPE_SINT32:
    bVar1 = FieldDescriptor::is_packed(local_28);
    if (bVar1) {
      iVar3 = FieldDescriptor::number(local_28);
      local_c1 = kFastZ32P1;
      if (0xf < iVar3) {
        local_c1 = kFastZ32P2;
      }
      local_c3 = local_c1;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(local_28);
      if (bVar1) {
        iVar3 = FieldDescriptor::number(local_28);
        local_c4 = kFastZ32R1;
        if (0xf < iVar3) {
          local_c4 = kFastZ32R2;
        }
        local_c6 = local_c4;
      }
      else {
        iVar3 = FieldDescriptor::number(local_28);
        local_c7 = kFastZ32S1;
        if (0xf < iVar3) {
          local_c7 = kFastZ32S2;
        }
        local_c6 = local_c7;
      }
      local_c3 = local_c6;
    }
    local_65 = local_c3;
    break;
  case MAX_TYPE:
    bVar1 = FieldDescriptor::is_packed(local_28);
    if (bVar1) {
      iVar3 = FieldDescriptor::number(local_28);
      local_d1 = kFastZ64P1;
      if (0xf < iVar3) {
        local_d1 = kFastZ64P2;
      }
      local_d3 = local_d1;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(local_28);
      if (bVar1) {
        iVar3 = FieldDescriptor::number(local_28);
        local_d4 = kFastZ64R1;
        if (0xf < iVar3) {
          local_d4 = kFastZ64R2;
        }
        local_d6 = local_d4;
      }
      else {
        iVar3 = FieldDescriptor::number(local_28);
        local_d7 = kFastZ64S1;
        if (0xf < iVar3) {
          local_d7 = kFastZ64S2;
        }
        local_d6 = local_d7;
      }
      local_d3 = local_d6;
    }
    local_65 = local_d3;
  }
  if (local_65 == kNone) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_88,"picked != TcParseFunction::kNone");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_gen.cc"
               ,0x109,local_88._M_len,local_88._M_str);
    pLVar6 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_66,pLVar6);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
  }
  __return_storage_ptr__->func = local_65;
  __return_storage_ptr__->presence_probability = *(float *)(message_options_local + 4);
  return __return_storage_ptr__;
}

Assistant:

TailCallTableInfo::FastFieldInfo::Field MakeFastFieldEntry(
    const TailCallTableInfo::FieldEntryInfo& entry,
    const TailCallTableInfo::FieldOptions& options,
    const TailCallTableInfo::MessageOptions& message_options) {
  TailCallTableInfo::FastFieldInfo::Field info{};
#define PROTOBUF_PICK_FUNCTION(fn) \
  (field->number() < 16 ? TcParseFunction::fn##1 : TcParseFunction::fn##2)

#define PROTOBUF_PICK_SINGLE_FUNCTION(fn) PROTOBUF_PICK_FUNCTION(fn##S)

#define PROTOBUF_PICK_REPEATABLE_FUNCTION(fn)           \
  (field->is_repeated() ? PROTOBUF_PICK_FUNCTION(fn##R) \
                        : PROTOBUF_PICK_FUNCTION(fn##S))

#define PROTOBUF_PICK_PACKABLE_FUNCTION(fn)               \
  (field->is_packed()     ? PROTOBUF_PICK_FUNCTION(fn##P) \
   : field->is_repeated() ? PROTOBUF_PICK_FUNCTION(fn##R) \
                          : PROTOBUF_PICK_FUNCTION(fn##S))

#define PROTOBUF_PICK_STRING_FUNCTION(fn)                            \
  (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord \
       ? PROTOBUF_PICK_FUNCTION(fn##cS)                              \
   : options.is_string_inlined ? PROTOBUF_PICK_FUNCTION(fn##iS)      \
                               : PROTOBUF_PICK_REPEATABLE_FUNCTION(fn))

  const FieldDescriptor* field = entry.field;
  info.aux_idx = static_cast<uint8_t>(entry.aux_idx);
  if (field->type() == FieldDescriptor::TYPE_BYTES ||
      field->type() == FieldDescriptor::TYPE_STRING) {
    if (options.is_string_inlined) {
      ABSL_CHECK(!field->is_repeated());
      info.aux_idx = static_cast<uint8_t>(entry.inlined_string_idx);
    }
  }

  TcParseFunction picked = TcParseFunction::kNone;
  switch (field->type()) {
    case FieldDescriptor::TYPE_BOOL:
      picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastV8);
      break;
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_UINT32:
      picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastV32);
      break;
    case FieldDescriptor::TYPE_SINT32:
      picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastZ32);
      break;
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
      picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastV64);
      break;
    case FieldDescriptor::TYPE_SINT64:
      picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastZ64);
      break;
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_SFIXED32:
      picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastF32);
      break;
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED64:
      picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastF64);
      break;
    case FieldDescriptor::TYPE_ENUM:
      if (TreatEnumAsInt(field)) {
        picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastV32);
      } else {
        switch (GetEnumRangeInfo(field, info.aux_idx)) {
          case EnumRangeInfo::kNone:
            picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastEv);
            break;
          case EnumRangeInfo::kContiguous:
            picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastEr);
            break;
          case EnumRangeInfo::kContiguous0:
            picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastEr0);
            break;
          case EnumRangeInfo::kContiguous1:
            picked = PROTOBUF_PICK_PACKABLE_FUNCTION(kFastEr1);
            break;
        }
      }
      break;
    case FieldDescriptor::TYPE_BYTES:
      picked = PROTOBUF_PICK_STRING_FUNCTION(kFastB);
      break;
    case FieldDescriptor::TYPE_STRING:
      switch (entry.utf8_check_mode) {
        case cpp::Utf8CheckMode::kStrict:
          picked = PROTOBUF_PICK_STRING_FUNCTION(kFastU);
          break;
        case cpp::Utf8CheckMode::kVerify:
          picked = PROTOBUF_PICK_STRING_FUNCTION(kFastS);
          break;
        case cpp::Utf8CheckMode::kNone:
          picked = PROTOBUF_PICK_STRING_FUNCTION(kFastB);
          break;
      }
      break;
    case FieldDescriptor::TYPE_MESSAGE:
      picked =
          (HasLazyRep(field, options) ? PROTOBUF_PICK_SINGLE_FUNCTION(kFastMl)
           : options.use_direct_tcparser_table
               ? PROTOBUF_PICK_REPEATABLE_FUNCTION(kFastMt)
               : PROTOBUF_PICK_REPEATABLE_FUNCTION(kFastMd));
      break;
    case FieldDescriptor::TYPE_GROUP:
      picked = (options.use_direct_tcparser_table
                    ? PROTOBUF_PICK_REPEATABLE_FUNCTION(kFastGt)
                    : PROTOBUF_PICK_REPEATABLE_FUNCTION(kFastGd));
      break;
  }

  ABSL_CHECK(picked != TcParseFunction::kNone);
  info.func = picked;
  info.presence_probability = options.presence_probability;
  return info;

#undef PROTOBUF_PICK_FUNCTION
#undef PROTOBUF_PICK_SINGLE_FUNCTION
#undef PROTOBUF_PICK_REPEATABLE_FUNCTION
#undef PROTOBUF_PICK_PACKABLE_FUNCTION
#undef PROTOBUF_PICK_STRING_FUNCTION
}